

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ublox.cpp
# Opt level: O2

int __thiscall Ublox::testConnection(Ublox *this)

{
  UBXScanner *pUVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uchar from_gps_data;
  uchar to_gps_data;
  
  to_gps_data = '\0';
  from_gps_data = '\0';
  iVar2 = enableNAV_POSLLH(this);
  if (iVar2 < 0) {
    std::operator<<((ostream *)&std::cerr,"Could not configure ublox over SPI\n");
  }
  iVar2 = enableNAV_STATUS(this);
  if (iVar2 < 0) {
    std::operator<<((ostream *)&std::cerr,"Could not configure ublox over SPI\n");
  }
  iVar2 = enableNAV_TIMEGPS(this);
  if (iVar2 < 0) {
    std::operator<<((ostream *)&std::cerr,"Could not configure ublox over SPI\n");
  }
  iVar2 = 0x200;
  do {
    do {
      bVar4 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if (bVar4) {
        return 0;
      }
      SPIdev::transfer((this->spi_device_name)._M_dataplus._M_p,&to_gps_data,&from_gps_data,1,200000
                       ,'\b',0);
      iVar3 = UBXScanner::update(this->scanner,from_gps_data);
    } while (iVar3 != 9);
    iVar3 = UBXParser::checkMessage(this->parser);
    pUVar1 = this->scanner;
    pUVar1->message_length = 0;
    pUVar1->position = 0;
    pUVar1->state = Sync1;
  } while (iVar3 == 0);
  return 1;
}

Assistant:

int Ublox::testConnection()
{
    int status;
    int count = 0;
    unsigned char to_gps_data = 0x00, from_gps_data = 0x00;

    // we do this, so that at least one ubx message is enabled

    if (enableNAV_POSLLH()<0)
    {
        std::cerr << "Could not configure ublox over SPI\n";
    }

    if (enableNAV_STATUS()<0)
    {
        std::cerr << "Could not configure ublox over SPI\n";
    }

    if (enableNAV_TIMEGPS()<0)
    {
        std::cerr << "Could not configure ublox over SPI\n";
    }

    while (count < UBX_BUFFER_LENGTH/2)
    {
        // From now on, we will send zeroes to the receiver, which it will ignore
        // However, we are simultaneously getting useful information from it
        SPIdev::transfer(spi_device_name.c_str(), &to_gps_data, &from_gps_data, 1, 200000);

        // Scanner checks the message structure with every byte received
        status = scanner->update(from_gps_data);

        if (status == UBXScanner::Done)
        {
            // Once we have a full message we decode it and reset the scanner, making it look for another message
            // in the data stream, coming over SPI

            // If we find at least one valid message in the buffer, we consider connection to be established
            if(parser->checkMessage()==1)
            {
                scanner->reset();
                return 1;
            }

            scanner->reset();
        }

        count++;
    }

    return 0;
}